

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O3

void btPolyhedralContactClipping::clipFaceAgainstHull
               (btVector3 *separatingNormal,btConvexPolyhedron *hullA,btTransform *transA,
               btVertexArray *worldVertsB1,btScalar minDist,btScalar maxDist,Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  btFace *pbVar9;
  int *piVar10;
  btVector3 *pbVar11;
  undefined8 uVar12;
  Result *pRVar13;
  btVertexArray *pbVar14;
  int iVar15;
  btVector3 *pbVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  btScalar *pbVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  btVertexArray *pVtxIn;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  btVertexArray worldVertsB2;
  btVector3 point;
  btVertexArray local_c8;
  undefined1 local_a8 [16];
  btVector3 local_98;
  btVector3 *local_80;
  Result *local_78;
  btConvexPolyhedron *local_70;
  btScalar local_68;
  undefined1 local_58 [16];
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_68 = minDist;
  local_c8.m_ownsMemory = true;
  local_c8.m_data = (btVector3 *)0x0;
  local_c8.m_size = 0;
  local_c8.m_capacity = 0;
  iVar15 = worldVertsB1->m_size;
  local_78 = resultOut;
  if ((long)iVar15 < 1) goto LAB_001838f4;
  pbVar16 = (btVector3 *)btAlignedAllocInternal((long)iVar15 << 4,0x10);
  if ((long)local_c8.m_size < 1) {
    if (local_c8.m_data != (btVector3 *)0x0) goto LAB_001838da;
  }
  else {
    lVar19 = 0;
    do {
      puVar1 = (undefined8 *)((long)(local_c8.m_data)->m_floats + lVar19);
      uVar12 = puVar1[1];
      puVar2 = (undefined8 *)((long)pbVar16->m_floats + lVar19);
      *puVar2 = *puVar1;
      puVar2[1] = uVar12;
      lVar19 = lVar19 + 0x10;
    } while ((long)local_c8.m_size * 0x10 != lVar19);
LAB_001838da:
    if (local_c8.m_ownsMemory == true) {
      btAlignedFreeInternal(local_c8.m_data);
    }
  }
  local_c8.m_ownsMemory = true;
  local_c8.m_data = pbVar16;
  local_c8.m_capacity = iVar15;
LAB_001838f4:
  local_c8.m_ownsMemory = true;
  uVar17 = (ulong)(hullA->m_faces).m_size;
  if (0 < (long)uVar17) {
    pbVar20 = ((hullA->m_faces).m_data)->m_plane + 2;
    fVar35 = 3.4028235e+38;
    uVar21 = 0xffffffff;
    uVar22 = 0;
    do {
      fVar36 = pbVar20[-2];
      fVar25 = pbVar20[-1];
      fVar3 = *pbVar20;
      fVar36 = (fVar3 * (transA->m_basis).m_el[2].m_floats[2] +
               fVar36 * (transA->m_basis).m_el[2].m_floats[0] +
               fVar25 * (transA->m_basis).m_el[2].m_floats[1]) * separatingNormal->m_floats[2] +
               ((transA->m_basis).m_el[1].m_floats[2] * fVar3 +
               (transA->m_basis).m_el[1].m_floats[0] * fVar36 +
               fVar25 * (transA->m_basis).m_el[1].m_floats[1]) * separatingNormal->m_floats[1] +
               ((transA->m_basis).m_el[0].m_floats[2] * fVar3 +
               (transA->m_basis).m_el[0].m_floats[0] * fVar36 +
               fVar25 * (transA->m_basis).m_el[0].m_floats[1]) * separatingNormal->m_floats[0];
      if (fVar36 < fVar35) {
        uVar21 = uVar22 & 0xffffffff;
        fVar35 = fVar36;
      }
      uVar22 = uVar22 + 1;
      pbVar20 = pbVar20 + 0xc;
    } while (uVar17 != uVar22);
    if (-1 < (int)uVar21) {
      local_80 = separatingNormal;
      pbVar9 = (hullA->m_faces).m_data;
      uVar17 = (ulong)pbVar9[uVar21].m_indices.m_size;
      if (0 < (long)uVar17) {
        uVar22 = 0;
        pbVar14 = &local_c8;
        pVtxIn = worldVertsB1;
        local_70 = hullA;
        do {
          worldVertsB1 = pbVar14;
          piVar10 = pbVar9[uVar21].m_indices.m_data;
          iVar15 = piVar10[uVar22];
          pbVar16 = (local_70->m_vertices).m_data;
          uVar22 = uVar22 + 1;
          uVar23 = 0;
          if (uVar22 != uVar17) {
            uVar23 = uVar22 & 0xffffffff;
          }
          iVar8 = piVar10[uVar23];
          fVar35 = pbVar16[iVar15].m_floats[0];
          fVar28 = fVar35 - pbVar16[iVar8].m_floats[0];
          fVar36 = pbVar16[iVar15].m_floats[1];
          fVar37 = fVar36 - pbVar16[iVar8].m_floats[1];
          fVar25 = pbVar16[iVar15].m_floats[2];
          fVar33 = fVar25 - pbVar16[iVar8].m_floats[2];
          fVar3 = (transA->m_basis).m_el[0].m_floats[0];
          local_a8 = ZEXT416((uint)fVar3);
          fVar30 = (transA->m_basis).m_el[0].m_floats[1];
          local_58 = ZEXT416((uint)fVar30);
          fVar27 = (transA->m_basis).m_el[0].m_floats[2];
          fVar38 = fVar27 * fVar33 + fVar3 * fVar28 + fVar37 * fVar30;
          fVar29 = (transA->m_basis).m_el[1].m_floats[0];
          fVar26 = (transA->m_basis).m_el[1].m_floats[1];
          fVar32 = pbVar9[uVar21].m_plane[0];
          fVar39 = pbVar9[uVar21].m_plane[1];
          fVar4 = (transA->m_basis).m_el[1].m_floats[2];
          fVar40 = pbVar9[uVar21].m_plane[2];
          fVar31 = fVar4 * fVar40 + fVar29 * fVar32 + fVar26 * fVar39;
          fVar5 = (transA->m_basis).m_el[2].m_floats[1];
          fVar6 = (transA->m_basis).m_el[2].m_floats[0];
          fVar7 = (transA->m_basis).m_el[2].m_floats[2];
          fVar34 = fVar33 * fVar4 + fVar28 * fVar29 + fVar26 * fVar37;
          fVar28 = fVar33 * fVar7 + fVar28 * fVar6 + fVar5 * fVar37;
          fVar33 = fVar40 * fVar7 + fVar32 * fVar6 + fVar39 * fVar5;
          fVar40 = fVar40 * fVar27 + fVar32 * fVar3 + fVar39 * fVar30;
          fVar32 = fVar31 * fVar38 - fVar40 * fVar34;
          fVar39 = -(fVar34 * fVar33 - fVar31 * fVar28);
          fVar40 = -(fVar28 * fVar40 - fVar33 * fVar38);
          local_98.m_floats[1] = fVar40;
          local_98.m_floats[0] = fVar39;
          local_98.m_floats[2] = -fVar32;
          local_98.m_floats[3] = 0.0;
          clipFace(pVtxIn,worldVertsB1,&local_98,
                   -(((fVar27 * fVar25 + fVar3 * fVar35 + fVar30 * fVar36 +
                      (transA->m_origin).m_floats[0]) * fVar39 +
                     fVar40 * (fVar4 * fVar25 + fVar29 * fVar35 + fVar26 * fVar36 +
                              (transA->m_origin).m_floats[1])) -
                    (fVar25 * fVar7 + fVar35 * fVar6 + fVar36 * fVar5 +
                    (transA->m_origin).m_floats[2]) * fVar32));
          lVar19 = (long)pVtxIn->m_size;
          if (lVar19 < 0) {
            if (pVtxIn->m_capacity < 0) {
              if ((pVtxIn->m_data != (btVector3 *)0x0) && (pVtxIn->m_ownsMemory == true)) {
                btAlignedFreeInternal(pVtxIn->m_data);
              }
              pVtxIn->m_ownsMemory = true;
              pVtxIn->m_data = (btVector3 *)0x0;
              pVtxIn->m_capacity = 0;
            }
            lVar18 = lVar19 << 4;
            do {
              puVar1 = (undefined8 *)((long)pVtxIn->m_data->m_floats + lVar18);
              *puVar1 = local_40;
              puVar1[1] = uStack_38;
              lVar18 = lVar18 + 0x10;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0);
          }
          pVtxIn->m_size = 0;
          pbVar14 = pVtxIn;
          pVtxIn = worldVertsB1;
        } while (uVar22 != uVar17);
      }
      pRVar13 = local_78;
      pbVar16 = local_80;
      iVar15 = worldVertsB1->m_size;
      if (0 < iVar15) {
        fVar35 = pbVar9[uVar21].m_plane[0];
        fVar36 = pbVar9[uVar21].m_plane[1];
        fVar25 = pbVar9[uVar21].m_plane[2];
        fVar3 = pbVar9[uVar21].m_plane[3];
        fVar29 = (transA->m_basis).m_el[0].m_floats[2] * fVar25 +
                 (transA->m_basis).m_el[0].m_floats[0] * fVar35 +
                 (transA->m_basis).m_el[0].m_floats[1] * fVar36;
        fVar30 = (transA->m_basis).m_el[1].m_floats[2] * fVar25 +
                 (transA->m_basis).m_el[1].m_floats[0] * fVar35 +
                 (transA->m_basis).m_el[1].m_floats[1] * fVar36;
        fVar27 = fVar25 * (transA->m_basis).m_el[2].m_floats[2] +
                 fVar35 * (transA->m_basis).m_el[2].m_floats[0] +
                 fVar36 * (transA->m_basis).m_el[2].m_floats[1];
        fVar25 = (transA->m_origin).m_floats[1] * fVar30;
        fVar35 = (transA->m_origin).m_floats[0];
        fVar36 = (transA->m_origin).m_floats[2];
        lVar19 = 0;
        lVar18 = 0;
        local_a8._0_4_ = fVar30;
        do {
          pbVar11 = worldVertsB1->m_data;
          fVar26 = *(float *)((long)pbVar11->m_floats + lVar19 + 8) * fVar27 +
                   *(float *)((long)pbVar11->m_floats + lVar19) * fVar29 +
                   *(float *)((long)pbVar11->m_floats + lVar19 + 4) * fVar30 +
                   (fVar3 - (fVar36 * fVar27 + fVar35 * fVar29 + fVar25));
          uVar24 = -(uint)(fVar26 <= local_68);
          if ((float)(uVar24 & (uint)local_68 | ~uVar24 & (uint)fVar26) <= maxDist) {
            local_98.m_floats = *(btScalar (*) [4])((long)pbVar11->m_floats + lVar19);
            (*pRVar13->_vptr_Result[4])(pRVar13,pbVar16,&local_98);
            iVar15 = worldVertsB1->m_size;
            fVar30 = (float)local_a8._0_4_;
          }
          lVar18 = lVar18 + 1;
          lVar19 = lVar19 + 0x10;
        } while (lVar18 < iVar15);
      }
    }
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_c8);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipFaceAgainstHull(const btVector3& separatingNormal, const btConvexPolyhedron& hullA,  const btTransform& transA, btVertexArray& worldVertsB1, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	btVertexArray worldVertsB2;
	btVertexArray* pVtxIn = &worldVertsB1;
	btVertexArray* pVtxOut = &worldVertsB2;
	pVtxOut->reserve(pVtxIn->size());

	int closestFaceA=-1;
	{
		btScalar dmin = FLT_MAX;
		for(int face=0;face<hullA.m_faces.size();face++)
		{
			const btVector3 Normal(hullA.m_faces[face].m_plane[0], hullA.m_faces[face].m_plane[1], hullA.m_faces[face].m_plane[2]);
			const btVector3 faceANormalWS = transA.getBasis() * Normal;
		
			btScalar d = faceANormalWS.dot(separatingNormal);
			if (d < dmin)
			{
				dmin = d;
				closestFaceA = face;
			}
		}
	}
	if (closestFaceA<0)
		return;

	const btFace& polyA = hullA.m_faces[closestFaceA];

		// clip polygon to back of planes of all faces of hull A that are adjacent to witness face
	int numVerticesA = polyA.m_indices.size();
	for(int e0=0;e0<numVerticesA;e0++)
	{
		const btVector3& a = hullA.m_vertices[polyA.m_indices[e0]];
		const btVector3& b = hullA.m_vertices[polyA.m_indices[(e0+1)%numVerticesA]];
		const btVector3 edge0 = a - b;
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		btVector3 worldPlaneAnormal1 = transA.getBasis()* btVector3(polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);

		btVector3 planeNormalWS1 = -WorldEdge0.cross(worldPlaneAnormal1);//.cross(WorldEdge0);
		btVector3 worldA1 = transA*a;
		btScalar planeEqWS1 = -worldA1.dot(planeNormalWS1);
		
//int otherFace=0;
#ifdef BLA1
		int otherFace = polyA.m_connectedFaces[e0];
		btVector3 localPlaneNormal (hullA.m_faces[otherFace].m_plane[0],hullA.m_faces[otherFace].m_plane[1],hullA.m_faces[otherFace].m_plane[2]);
		btScalar localPlaneEq = hullA.m_faces[otherFace].m_plane[3];

		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
#else 
		btVector3 planeNormalWS = planeNormalWS1;
		btScalar planeEqWS=planeEqWS1;
		
#endif
		//clip face

		clipFace(*pVtxIn, *pVtxOut,planeNormalWS,planeEqWS);
		btSwap(pVtxIn,pVtxOut);
		pVtxOut->resize(0);
	}



//#define ONLY_REPORT_DEEPEST_POINT

	btVector3 point;
	

	// only keep points that are behind the witness face
	{
		btVector3 localPlaneNormal (polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);
		btScalar localPlaneEq = polyA.m_plane[3];
		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
		for (int i=0;i<pVtxIn->size();i++)
		{
			btVector3 vtx = pVtxIn->at(i);
			btScalar depth = planeNormalWS.dot(vtx)+planeEqWS;
			if (depth <=minDist)
			{
//				printf("clamped: depth=%f to minDist=%f\n",depth,minDist);
				depth = minDist;
			}

			if (depth <=maxDist)
			{
				btVector3 point = pVtxIn->at(i);
#ifdef ONLY_REPORT_DEEPEST_POINT
				curMaxDist = depth;
#else
#if 0
				if (depth<-3)
				{
					printf("error in btPolyhedralContactClipping depth = %f\n", depth);
					printf("likely wrong separatingNormal passed in\n");
				} 
#endif				
				resultOut.addContactPoint(separatingNormal,point,depth);
#endif
			}
		}
	}
#ifdef ONLY_REPORT_DEEPEST_POINT
	if (curMaxDist<maxDist)
	{
		resultOut.addContactPoint(separatingNormal,point,curMaxDist);
	}
#endif //ONLY_REPORT_DEEPEST_POINT

}